

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

size_t __thiscall dynet::Model::updated_parameter_count(Model *this)

{
  bool bVar1;
  int iVar2;
  const_reference ppPVar3;
  undefined4 extraout_var;
  reference puVar4;
  const_reference ppLVar5;
  undefined4 extraout_var_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint idx_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  uint idx;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  size_t r;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  pointer *local_38;
  uint local_2c;
  uint *local_28;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_20;
  pointer *local_18;
  size_t local_10;
  
  local_10 = 0;
  local_18 = &in_RDI[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_20._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_RDI);
  local_28 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_20);
    local_2c = *puVar4;
    ppPVar3 = std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::
              operator[]((vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                          *)&in_RDI[1].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,(ulong)local_2c);
    iVar2 = (*((*ppPVar3)->super_ParameterStorageBase)._vptr_ParameterStorageBase[4])();
    local_10 = CONCAT44(extraout_var,iVar2) + local_10;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_20);
  }
  local_38 = &in_RDI[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_40._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_40);
    in_stack_ffffffffffffffb4 = *puVar4;
    ppLVar5 = std::
              vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
              ::operator[]((vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                            *)&in_RDI[2].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,
                           (ulong)in_stack_ffffffffffffffb4);
    iVar2 = (*((*ppLVar5)->super_ParameterStorageBase)._vptr_ParameterStorageBase[4])();
    local_10 = CONCAT44(extraout_var_00,iVar2) + local_10;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_40);
  }
  return local_10;
}

Assistant:

size_t Model::updated_parameter_count() const {
  size_t r = 0;
  for (const unsigned idx : updated_params) {
    r += params[idx]->size();
  }
  for (const unsigned idx : updated_lookup_params) {
    r += lookup_params[idx]->size();
  }
  return r;
}